

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *msg_00;
  cmMakefile *pcVar1;
  bool bVar2;
  undefined8 __first;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  TargetType TVar7;
  size_type sVar8;
  char *pcVar9;
  reference pbVar10;
  long lVar11;
  ostream *poVar12;
  cmTarget *pcVar13;
  cmState *this_00;
  const_reference pvVar14;
  const_iterator __last;
  PolicyID id;
  char *local_29c0;
  byte local_285a;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2808;
  const_iterator local_2800;
  allocator local_27f1;
  string local_27f0 [8];
  string msg_1;
  string local_27c8;
  undefined1 local_27a8 [8];
  ostringstream e_21;
  undefined1 local_2630 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string msg;
  string local_25f0;
  string local_25d0;
  undefined1 local_25b0 [8];
  ostringstream e_20;
  string local_2438;
  undefined1 local_2418 [8];
  ostringstream e_19;
  allocator local_2299;
  string local_2298;
  allocator local_2271;
  string local_2270;
  string local_2250;
  undefined1 local_2230 [8];
  ostringstream w;
  allocator local_20b1;
  string local_20b0;
  allocator local_2089;
  string local_2088;
  allocator local_2061;
  string local_2060;
  string local_2040;
  undefined1 local_2020 [8];
  ostringstream e_18;
  string local_1ea8;
  undefined1 local_1e88 [8];
  ostringstream e_17;
  undefined1 local_1d08 [4];
  TargetType aliasedType;
  undefined1 local_1ce8 [8];
  ostringstream e_16;
  allocator local_1b69;
  string local_1b68;
  cmTarget *local_1b48;
  cmTarget *aliasedTarget;
  undefined1 local_1b20 [8];
  ostringstream e_15;
  allocator local_19a1;
  string local_19a0;
  char *local_1980;
  char *aliasedName;
  undefined1 local_1958 [8];
  ostringstream e_14;
  allocator local_17d9;
  string local_17d8;
  allocator local_17b1;
  string local_17b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1790;
  string local_1770;
  string local_1750;
  byte local_1729;
  undefined1 local_1728 [7];
  bool issueMessage;
  ostringstream e_13;
  MessageType local_15b0;
  bool local_15a9;
  MessageType messageType;
  bool nameOk;
  undefined1 local_1588 [8];
  ostringstream e_12;
  string local_1410;
  undefined1 local_13f0 [8];
  ostringstream e_11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1278;
  string local_1270;
  undefined1 local_1250 [8];
  ostringstream e_10;
  string local_10d8;
  undefined1 local_10b8 [8];
  ostringstream e_9;
  string local_f40;
  undefined1 local_f20 [8];
  ostringstream e_8;
  string local_da8;
  undefined1 local_d88 [8];
  ostringstream e_7;
  string local_c10;
  undefined1 local_bf0 [8];
  ostringstream e_6;
  string local_a78;
  undefined1 local_a58 [8];
  ostringstream e_5;
  string local_8e0;
  undefined1 local_8c0 [8];
  ostringstream e_4;
  string local_748;
  undefined1 local_728 [8];
  ostringstream e_3;
  string local_5b0;
  undefined1 local_590 [8];
  ostringstream e_2;
  string local_418;
  undefined1 local_3f8 [8];
  ostringstream e_1;
  int local_27c;
  string local_278;
  undefined1 local_258 [8];
  ostringstream e;
  undefined1 local_e0 [8];
  string libType;
  undefined1 local_b0 [6];
  bool isAlias;
  bool haveSpecifiedType;
  string libName;
  const_iterator s;
  undefined1 local_80 [4];
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  TargetType local_60;
  TargetType type;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddLibraryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004d11c3;
  }
  local_60 = SHARED_LIBRARY;
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"BUILD_SHARED_LIBS",(allocator *)((long)&s._M_current + 7));
  pcVar9 = cmMakefile::GetDefinition(pcVar1,(string *)local_80);
  bVar3 = cmSystemTools::IsOff(pcVar9);
  std::__cxx11::string::~string((string *)local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s._M_current + 7));
  if (bVar3) {
    local_60 = STATIC_LIBRARY;
  }
  s._M_current._6_1_ = 0;
  s._M_current._5_1_ = 0;
  s._M_current._4_1_ = 0;
  libName.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  pbVar10 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&libName.field_2 + 8));
  std::__cxx11::string::string((string *)local_b0,(string *)pbVar10);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&libName.field_2 + 8));
  bVar3 = false;
  bVar2 = false;
  do {
    libType.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&libName.field_2 + 8),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&libType.field_2 + 8));
    if (!bVar4) goto LAB_004cf70d;
    pbVar10 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&libName.field_2 + 8));
    std::__cxx11::string::string((string *)local_e0,(string *)pbVar10);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e0,"STATIC");
    if (bVar4) {
      if (local_60 != INTERFACE_LIBRARY) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&libName.field_2 + 8));
        local_60 = STATIC_LIBRARY;
        bVar3 = true;
        goto LAB_004cf6bf;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
      std::operator<<((ostream *)local_258,
                      "INTERFACE library specified with conflicting STATIC type.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      this_local._7_1_ = 0;
      local_27c = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e0,"SHARED");
      if (bVar4) {
        if (local_60 != INTERFACE_LIBRARY) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&libName.field_2 + 8));
          local_60 = SHARED_LIBRARY;
          bVar3 = true;
          goto LAB_004cf6bf;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
        std::operator<<((ostream *)local_3f8,
                        "INTERFACE library specified with conflicting SHARED type.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        this_local._7_1_ = 0;
        local_27c = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e0,"MODULE");
        if (bVar4) {
          if (local_60 != INTERFACE_LIBRARY) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libName.field_2 + 8));
            local_60 = MODULE_LIBRARY;
            bVar3 = true;
            goto LAB_004cf6bf;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
          std::operator<<((ostream *)local_590,
                          "INTERFACE library specified with conflicting MODULE type.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_5b0);
          std::__cxx11::string::~string((string *)&local_5b0);
          this_local._7_1_ = 0;
          local_27c = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e0,"OBJECT");
          if (bVar4) {
            if (local_60 != INTERFACE_LIBRARY) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&libName.field_2 + 8));
              local_60 = OBJECT_LIBRARY;
              bVar3 = true;
              goto LAB_004cf6bf;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
            std::operator<<((ostream *)local_728,
                            "INTERFACE library specified with conflicting OBJECT type.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_748);
            std::__cxx11::string::~string((string *)&local_748);
            this_local._7_1_ = 0;
            local_27c = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0,"UNKNOWN");
            if (bVar4) {
              if (local_60 != INTERFACE_LIBRARY) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&libName.field_2 + 8));
                local_60 = UNKNOWN_LIBRARY;
                bVar3 = true;
                goto LAB_004cf6bf;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
              std::operator<<((ostream *)local_8c0,
                              "INTERFACE library specified with conflicting UNKNOWN type.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_8e0);
              std::__cxx11::string::~string((string *)&local_8e0);
              this_local._7_1_ = 0;
              local_27c = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_e0,"ALIAS");
              if (bVar4) {
                if (local_60 != INTERFACE_LIBRARY) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&libName.field_2 + 8));
                  bVar2 = true;
                  goto LAB_004cf6bf;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a58);
                std::operator<<((ostream *)local_a58,
                                "INTERFACE library specified with conflicting ALIAS type.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_a78);
                std::__cxx11::string::~string((string *)&local_a78);
                this_local._7_1_ = 0;
                local_27c = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a58);
              }
              else {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e0,"INTERFACE");
                if (bVar4) {
                  if (bVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bf0);
                    std::operator<<((ostream *)local_bf0,
                                    "INTERFACE library specified with conflicting/multiple types.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_c10);
                    std::__cxx11::string::~string((string *)&local_c10);
                    this_local._7_1_ = 0;
                    local_27c = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bf0);
                  }
                  else if (bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d88);
                    std::operator<<((ostream *)local_d88,
                                    "INTERFACE library specified with conflicting ALIAS type.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_da8);
                    std::__cxx11::string::~string((string *)&local_da8);
                    this_local._7_1_ = 0;
                    local_27c = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d88);
                  }
                  else {
                    if ((s._M_current._6_1_ & 1) == 0) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&libName.field_2 + 8));
                      local_60 = INTERFACE_LIBRARY;
                      bVar3 = true;
                      goto LAB_004cf6bf;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f20);
                    std::operator<<((ostream *)local_f20,
                                    "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_f40);
                    std::__cxx11::string::~string((string *)&local_f40);
                    this_local._7_1_ = 0;
                    local_27c = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f20);
                  }
                }
                else {
                  pbVar10 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&libName.field_2 + 8));
                  bVar4 = std::operator==(pbVar10,"EXCLUDE_FROM_ALL");
                  if (bVar4) {
                    if (local_60 != INTERFACE_LIBRARY) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&libName.field_2 + 8));
                      s._M_current._6_1_ = 1;
                      goto LAB_004cf6bf;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10b8);
                    std::operator<<((ostream *)local_10b8,
                                    "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_10d8);
                    std::__cxx11::string::~string((string *)&local_10d8);
                    this_local._7_1_ = 0;
                    local_27c = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10b8);
                  }
                  else {
                    pbVar10 = __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)((long)&libName.field_2 + 8));
                    bVar4 = std::operator==(pbVar10,"IMPORTED");
                    if (bVar4) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&libName.field_2 + 8));
                      s._M_current._5_1_ = 1;
LAB_004cf6bf:
                      local_27c = 0;
                    }
                    else {
                      if ((s._M_current._5_1_ & 1) != 0) {
                        pbVar10 = __gnu_cxx::
                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&libName.field_2 + 8));
                        bVar4 = std::operator==(pbVar10,"GLOBAL");
                        if (bVar4) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&libName.field_2 + 8));
                          s._M_current._4_1_ = 1;
                          goto LAB_004cf6bf;
                        }
                      }
                      if (local_60 == INTERFACE_LIBRARY) {
                        pbVar10 = __gnu_cxx::
                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&libName.field_2 + 8));
                        bVar4 = std::operator==(pbVar10,"GLOBAL");
                        if (bVar4) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1250);
                          std::operator<<((ostream *)local_1250,
                                          "GLOBAL option may only be used with IMPORTED libraries.")
                          ;
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_1270);
                          std::__cxx11::string::~string((string *)&local_1270);
                          this_local._7_1_ = 0;
                          local_27c = 1;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1250);
                          goto LAB_004cf6c9;
                        }
                      }
                      local_27c = 3;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_004cf6c9:
    std::__cxx11::string::~string((string *)local_e0);
  } while (local_27c == 0);
  if (local_27c == 3) {
LAB_004cf70d:
    if (local_60 == INTERFACE_LIBRARY) {
      local_1278._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libName.field_2 + 8),&local_1278);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13f0);
        std::operator<<((ostream *)local_13f0,"INTERFACE library requires no source arguments.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1410);
        std::__cxx11::string::~string((string *)&local_1410);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13f0);
      }
      else {
        if (((s._M_current._4_1_ & 1) == 0) || ((s._M_current._5_1_ & 1) != 0)) goto LAB_004cf8b7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1588);
        std::operator<<((ostream *)local_1588,
                        "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&messageType);
        std::__cxx11::string::~string((string *)&messageType);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1588);
      }
    }
    else {
LAB_004cf8b7:
      bVar4 = cmGeneratorExpression::IsValidTargetName((string *)local_b0);
      local_285a = 0;
      if (bVar4) {
        bVar4 = cmGlobalGenerator::IsReservedTarget((string *)local_b0);
        local_285a = bVar4 ^ 0xff;
      }
      local_15a9 = (bool)(local_285a & 1);
      if (((local_15a9 != false) && ((s._M_current._5_1_ & 1) == 0)) && (!bVar2)) {
        lVar11 = std::__cxx11::string::find(local_b0,0x91f4e4);
        local_15a9 = lVar11 == -1;
      }
      if (local_15a9 == false) {
        local_15b0 = AUTHOR_WARNING;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1728);
        local_1729 = 0;
        PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
        if (PVar6 != OLD) {
          if (PVar6 == WARN) {
            if (local_60 != INTERFACE_LIBRARY) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1750,(cmPolicies *)0x25,id);
              poVar12 = std::operator<<((ostream *)local_1728,(string *)&local_1750);
              std::operator<<(poVar12,"\n");
              std::__cxx11::string::~string((string *)&local_1750);
              local_1729 = 1;
            }
          }
          else if (PVar6 - NEW < 3) {
            local_1729 = 1;
            local_15b0 = FATAL_ERROR;
          }
        }
        if ((local_1729 & 1) == 0) {
LAB_004cfb58:
          bVar4 = false;
        }
        else {
          poVar12 = std::operator<<((ostream *)local_1728,"The target name \"");
          poVar12 = std::operator<<(poVar12,(string *)local_b0);
          std::operator<<(poVar12,
                          "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                         );
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,local_15b0,&local_1770,false);
          std::__cxx11::string::~string((string *)&local_1770);
          if (local_15b0 != FATAL_ERROR) goto LAB_004cfb58;
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1728);
        if (bVar4) goto LAB_004d11a7;
      }
      if (bVar2) {
        bVar3 = cmGeneratorExpression::IsValidTargetName((string *)local_b0);
        if (bVar3) {
          if ((s._M_current._6_1_ & 1) == 0) {
            if (((s._M_current._5_1_ & 1) == 0) && ((s._M_current._4_1_ & 1) == 0)) {
              sVar8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local);
              if (sVar8 == 3) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&libName.field_2 + 8));
                pcVar9 = (char *)std::__cxx11::string::c_str();
                pcVar1 = (this->super_cmCommand).Makefile;
                local_1980 = pcVar9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_19a0,pcVar9,&local_19a1);
                bVar3 = cmMakefile::IsAlias(pcVar1,&local_19a0);
                std::__cxx11::string::~string((string *)&local_19a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_19a1);
                pcVar9 = local_1980;
                if (bVar3) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b20);
                  poVar12 = std::operator<<((ostream *)local_1b20,"cannot create ALIAS target \"");
                  poVar12 = std::operator<<(poVar12,(string *)local_b0);
                  poVar12 = std::operator<<(poVar12,"\" because target \"");
                  poVar12 = std::operator<<(poVar12,local_1980);
                  std::operator<<(poVar12,"\" is itself an ALIAS.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
                  std::__cxx11::string::~string((string *)&aliasedTarget);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b20);
                }
                else {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_1b68,pcVar9,&local_1b69);
                  pcVar13 = cmMakefile::FindTargetToUse(pcVar1,&local_1b68,true);
                  std::__cxx11::string::~string((string *)&local_1b68);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
                  local_1b48 = pcVar13;
                  if (pcVar13 == (cmTarget *)0x0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ce8);
                    poVar12 = std::operator<<((ostream *)local_1ce8,"cannot create ALIAS target \"")
                    ;
                    poVar12 = std::operator<<(poVar12,(string *)local_b0);
                    poVar12 = std::operator<<(poVar12,"\" because target \"");
                    poVar12 = std::operator<<(poVar12,local_1980);
                    std::operator<<(poVar12,"\" does not already exist.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_1d08);
                    std::__cxx11::string::~string((string *)local_1d08);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ce8);
                  }
                  else {
                    TVar7 = cmTarget::GetType(pcVar13);
                    if ((((TVar7 == SHARED_LIBRARY) || (TVar7 == STATIC_LIBRARY)) ||
                        (TVar7 == MODULE_LIBRARY)) ||
                       ((TVar7 == OBJECT_LIBRARY || (TVar7 == INTERFACE_LIBRARY)))) {
                      bVar3 = cmTarget::IsImported(local_1b48);
                      pcVar9 = local_1980;
                      if (bVar3) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2020);
                        poVar12 = std::operator<<((ostream *)local_2020,
                                                  "cannot create ALIAS target \"");
                        poVar12 = std::operator<<(poVar12,(string *)local_b0);
                        poVar12 = std::operator<<(poVar12,"\" because target \"");
                        poVar12 = std::operator<<(poVar12,local_1980);
                        std::operator<<(poVar12,"\" is IMPORTED.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_2040);
                        std::__cxx11::string::~string((string *)&local_2040);
                        this_local._7_1_ = 0;
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2020);
                      }
                      else {
                        pcVar1 = (this->super_cmCommand).Makefile;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_2060,pcVar9,&local_2061);
                        cmMakefile::AddAlias(pcVar1,(string *)local_b0,&local_2060);
                        std::__cxx11::string::~string((string *)&local_2060);
                        std::allocator<char>::~allocator((allocator<char> *)&local_2061);
                        this_local._7_1_ = 1;
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e88);
                      poVar12 = std::operator<<((ostream *)local_1e88,
                                                "cannot create ALIAS target \"");
                      poVar12 = std::operator<<(poVar12,(string *)local_b0);
                      poVar12 = std::operator<<(poVar12,"\" because target \"");
                      poVar12 = std::operator<<(poVar12,local_1980);
                      std::operator<<(poVar12,"\" is not a library.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_1ea8);
                      std::__cxx11::string::~string((string *)&local_1ea8);
                      this_local._7_1_ = 0;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e88);
                    }
                  }
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1958);
                std::operator<<((ostream *)local_1958,"ALIAS requires exactly one target argument.")
                ;
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
                std::__cxx11::string::~string((string *)&aliasedName);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1958);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_17d8,"IMPORTED with ALIAS is not allowed.",&local_17d9);
              cmCommand::SetError(&this->super_cmCommand,&local_17d8);
              std::__cxx11::string::~string((string *)&local_17d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_17d9);
              this_local._7_1_ = 0;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_17b0,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",
                       &local_17b1);
            cmCommand::SetError(&this->super_cmCommand,&local_17b0);
            std::__cxx11::string::~string((string *)&local_17b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
            this_local._7_1_ = 0;
          }
        }
        else {
          std::operator+(&local_1790,"Invalid name for ALIAS: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0);
          cmCommand::SetError(&this->super_cmCommand,&local_1790);
          std::__cxx11::string::~string((string *)&local_1790);
          this_local._7_1_ = 0;
        }
      }
      else if (((s._M_current._5_1_ & 1) == 0) || ((s._M_current._6_1_ & 1) == 0)) {
        bVar4 = false;
        bVar2 = false;
        if ((local_60 == SHARED_LIBRARY) || (bVar5 = false, local_60 == MODULE_LIBRARY)) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          std::allocator<char>::allocator();
          bVar4 = true;
          std::__cxx11::string::string
                    ((string *)&local_20b0,"TARGET_SUPPORTS_SHARED_LIBS",&local_20b1);
          bVar2 = true;
          bVar5 = cmState::GetGlobalPropertyAsBool(this_00,&local_20b0);
          bVar5 = !bVar5;
        }
        if (bVar2) {
          std::__cxx11::string::~string((string *)&local_20b0);
        }
        if (bVar4) {
          std::allocator<char>::~allocator((allocator<char> *)&local_20b1);
        }
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2230);
          poVar12 = std::operator<<((ostream *)local_2230,"ADD_LIBRARY called with ");
          if (local_60 == SHARED_LIBRARY) {
            local_29c0 = "SHARED";
          }
          else {
            local_29c0 = "MODULE";
          }
          poVar12 = std::operator<<(poVar12,local_29c0);
          std::operator<<(poVar12,
                          " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                         );
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2250,false);
          std::__cxx11::string::~string((string *)&local_2250);
          local_60 = STATIC_LIBRARY;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2230);
        }
        if ((s._M_current._5_1_ & 1) == 0) {
          if (local_60 == UNKNOWN_LIBRARY) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_25f0,
                       "The UNKNOWN library type may be used only for IMPORTED libraries.",
                       (allocator *)(msg.field_2._M_local_buf + 0xf));
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_25f0,false);
            std::__cxx11::string::~string((string *)&local_25f0);
            std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 1;
          }
          else {
            msg_00 = &srclists.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)msg_00);
            bVar3 = cmMakefile::EnforceUniqueName
                              ((this->super_cmCommand).Makefile,(string *)local_b0,(string *)msg_00,
                               false);
            if (!bVar3) {
              cmCommand::SetError(&this->super_cmCommand,
                                  (string *)
                                  &srclists.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              this_local._7_1_ = 0;
            }
            std::__cxx11::string::~string
                      ((string *)
                       &srclists.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2630);
              if (local_60 == INTERFACE_LIBRARY) {
                bVar3 = cmGeneratorExpression::IsValidTargetName((string *)local_b0);
                if ((bVar3) &&
                   (lVar11 = std::__cxx11::string::find(local_b0,0x8f6584), lVar11 == -1)) {
                  cmMakefile::AddLibrary
                            ((this->super_cmCommand).Makefile,(string *)local_b0,local_60,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2630,(bool)(s._M_current._6_1_ & 1));
                  this_local._7_1_ = 1;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27a8);
                  poVar12 = std::operator<<((ostream *)local_27a8,
                                            "Invalid name for INTERFACE library target: ");
                  std::operator<<(poVar12,(string *)local_b0);
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_27c8);
                  std::__cxx11::string::~string((string *)&local_27c8);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27a8);
                }
              }
              else {
                msg_1.field_2._8_8_ =
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
                bVar3 = __gnu_cxx::operator==
                                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&libName.field_2 + 8),
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&msg_1.field_2 + 8));
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_27f0,"You have called ADD_LIBRARY for library ",&local_27f1);
                  std::allocator<char>::~allocator((allocator<char> *)&local_27f1);
                  pvVar14 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)param_2_local,0);
                  std::__cxx11::string::operator+=(local_27f0,(string *)pvVar14);
                  std::__cxx11::string::operator+=
                            (local_27f0,
                             " without any source files. This typically indicates a problem ");
                  std::__cxx11::string::operator+=(local_27f0,"with your CMakeLists.txt file");
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  cmSystemTools::Message(pcVar9,"Warning");
                  std::__cxx11::string::~string(local_27f0);
                }
                local_2808._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2630);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_2800,&local_2808);
                __first = libName.field_2._8_8_;
                __last = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_2630,local_2800,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__first,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__last._M_current);
                cmMakefile::AddLibrary
                          ((this->super_cmCommand).Makefile,(string *)local_b0,local_60,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2630,(bool)(s._M_current._6_1_ & 1));
                this_local._7_1_ = 1;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2630);
            }
          }
        }
        else if (bVar3) {
          if (local_60 == OBJECT_LIBRARY) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_2298,
                       "The OBJECT library type may not be used for IMPORTED libraries.",&local_2299
                      );
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2298,false);
            std::__cxx11::string::~string((string *)&local_2298);
            std::allocator<char>::~allocator((allocator<char> *)&local_2299);
            this_local._7_1_ = 1;
          }
          else if ((local_60 != INTERFACE_LIBRARY) ||
                  (bVar3 = cmGeneratorExpression::IsValidTargetName((string *)local_b0), bVar3)) {
            pcVar13 = cmMakefile::FindTargetToUse
                                ((this->super_cmCommand).Makefile,(string *)local_b0,false);
            if (pcVar13 == (cmTarget *)0x0) {
              cmMakefile::AddImportedTarget
                        ((this->super_cmCommand).Makefile,(string *)local_b0,local_60,
                         (bool)(s._M_current._4_1_ & 1));
              this_local._7_1_ = 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_25b0);
              poVar12 = std::operator<<((ostream *)local_25b0,"cannot create imported target \"");
              poVar12 = std::operator<<(poVar12,(string *)local_b0);
              std::operator<<(poVar12,"\" because another target with the same name already exists."
                             );
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_25d0);
              std::__cxx11::string::~string((string *)&local_25d0);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_25b0);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2418);
            poVar12 = std::operator<<((ostream *)local_2418,
                                      "Invalid name for IMPORTED INTERFACE library target: ");
            std::operator<<(poVar12,(string *)local_b0);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_2438);
            std::__cxx11::string::~string((string *)&local_2438);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2418);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2270,"called with IMPORTED argument but no library type.",
                     &local_2271);
          cmCommand::SetError(&this->super_cmCommand,&local_2270);
          std::__cxx11::string::~string((string *)&local_2270);
          std::allocator<char>::~allocator((allocator<char> *)&local_2271);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2088,"excludeFromAll with IMPORTED target makes no sense.",
                   &local_2089);
        cmCommand::SetError(&this->super_cmCommand,&local_2088);
        std::__cxx11::string::~string((string *)&local_2088);
        std::allocator<char>::~allocator((allocator<char> *)&local_2089);
        this_local._7_1_ = 0;
      }
    }
  }
LAB_004d11a7:
  std::__cxx11::string::~string((string *)local_b0);
LAB_004d11c3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddLibraryCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmState::TargetType type = cmState::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
    {
    type = cmState::STATIC_LIBRARY;
    }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while ( s != args.end() )
    {
    std::string libType = *s;
    if(libType == "STATIC")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::STATIC_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "SHARED")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::SHARED_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "MODULE")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::MODULE_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "OBJECT")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::OBJECT_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "UNKNOWN")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "ALIAS")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      isAlias = true;
      }
    else if(libType == "INTERFACE")
      {
      if (haveSpecifiedType)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
        }
      if (isAlias)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
        }
      if (excludeFromAll)
        {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(*s == "EXCLUDE_FROM_ALL")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      excludeFromAll = true;
      }
    else if(*s == "IMPORTED")
      {
      ++s;
      importTarget = true;
      }
    else if(importTarget && *s == "GLOBAL")
      {
      ++s;
      importGlobal = true;
      }
    else if(type == cmState::INTERFACE_LIBRARY && *s == "GLOBAL")
      {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
      }
    else
      {
      break;
      }
    }

  if (type == cmState::INTERFACE_LIBRARY)
    {
    if (s != args.end())
      {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
      }
    if (importGlobal && !importTarget)
      {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias)
    {
    nameOk = libName.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        if(type != cmState::INTERFACE_LIBRARY)
          {
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
          issueMessage = true;
          }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << libName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  if (isAlias)
    {
    if(!cmGeneratorExpression::IsValidTargetName(libName))
      {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
      }
    if(excludeFromAll)
      {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
      }
    if(importTarget || importGlobal)
      {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
      }
    if(args.size() != 3)
      {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
      }

    const char *aliasedName = s->c_str();
    if(this->Makefile->IsAlias(aliasedName))
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
      }
    cmTarget *aliasedTarget =
                    this->Makefile->FindTargetToUse(aliasedName, true);
    if(!aliasedTarget)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" does not already "
        "exist.";
      this->SetError(e.str());
      return false;
      }
    cmState::TargetType aliasedType = aliasedTarget->GetType();
    if(aliasedType != cmState::SHARED_LIBRARY
        && aliasedType != cmState::STATIC_LIBRARY
        && aliasedType != cmState::MODULE_LIBRARY
        && aliasedType != cmState::OBJECT_LIBRARY
        && aliasedType != cmState::INTERFACE_LIBRARY)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
      }
    if(aliasedTarget->IsImported())
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
    }

  if(importTarget && excludeFromAll)
    {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
    }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmState::SHARED_LIBRARY ||
       type == cmState::MODULE_LIBRARY) &&
       (this->Makefile->GetState()->GetGlobalPropertyAsBool(
                                      "TARGET_SUPPORTS_SHARED_LIBS") == false))
    {
    std::ostringstream w;
    w <<
      "ADD_LIBRARY called with " <<
      (type==cmState::SHARED_LIBRARY ? "SHARED" : "MODULE") <<
      " option but the target platform does not support dynamic linking. "
      "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    type = cmState::STATIC_LIBRARY;
    }

  // Handle imported target creation.
  if(importTarget)
    {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType)
      {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
      }
    if(type == cmState::OBJECT_LIBRARY)
      {
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        "The OBJECT library type may not be used for IMPORTED libraries."
        );
      return true;
      }
    if(type == cmState::INTERFACE_LIBRARY)
      {
      if (!cmGeneratorExpression::IsValidTargetName(libName))
        {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
        }
      }

    // Make sure the target does not already exist.
    if(this->Makefile->FindTargetToUse(libName))
      {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
      }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
    }

  // A non-imported target may not have UNKNOWN type.
  if(type == cmState::UNKNOWN_LIBRARY)
    {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries."
      );
    return true;
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(libName, msg))
    {
    this->SetError(msg);
    return false;
    }
  }

  std::vector<std::string> srclists;

  if(type == cmState::INTERFACE_LIBRARY)
    {
    if (!cmGeneratorExpression::IsValidTargetName(libName)
        || libName.find("::") != std::string::npos)
      {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
      }

    this->Makefile->AddLibrary(libName,
                               type,
                               srclists,
                               excludeFromAll);
    return true;
    }

  if (s == args.end())
    {
    std::string msg = "You have called ADD_LIBRARY for library ";
    msg += args[0];
    msg += " without any source files. This typically indicates a problem ";
    msg += "with your CMakeLists.txt file";
    cmSystemTools::Message(msg.c_str() ,"Warning");
    }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}